

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::try_to_store_message_from_timer_to_queue
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  anon_class_24_3_b3d561ce logging_lambda;
  bool bVar1;
  overflow_reaction_t oVar2;
  demand_t *pdVar3;
  type_index *in_stack_ffffffffffffff80;
  overflow_reaction_t reaction;
  undefined1 local_38 [3];
  bool queue_full;
  unique_lock<std::mutex> lock;
  deliver_op_tracer tracer;
  invocation_type_t demand_type_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
  *this_local;
  
  lock._12_4_ = demand_type;
  so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base::deliver_op_tracer::
  deliver_op_tracer((deliver_op_tracer *)&lock.field_0xb,(mchain_tracing_disabled_base *)this,
                    &this->super_abstract_message_chain_t,msg_type,message,demand_type);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_lock);
  if (this->m_status != closed) {
    bVar1 = details::unlimited_demand_queue::is_full(&this->m_queue);
    if (bVar1) {
      oVar2 = capacity_t::overflow_reaction(&this->m_capacity);
      if ((oVar2 == drop_newest) || (oVar2 == throw_exception)) {
        so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base::deliver_op_tracer::
        overflow_drop_newest((deliver_op_tracer *)&lock.field_0xb);
        goto LAB_00488d7f;
      }
      if (oVar2 == remove_oldest) {
        pdVar3 = details::unlimited_demand_queue::front(&this->m_queue);
        so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base::deliver_op_tracer::
        overflow_remove_oldest((deliver_op_tracer *)&lock.field_0xb,pdVar3);
        details::unlimited_demand_queue::pop_front(&this->m_queue);
      }
      else {
        logging_lambda.this =
             (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
              *)msg_type;
        logging_lambda.tracer = (deliver_op_tracer *)this;
        logging_lambda.msg_type = in_stack_ffffffffffffff80;
        so_5::details::
        abort_on_fatal_error<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>::try_to_store_message_from_timer_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                  (logging_lambda);
      }
    }
    complete_store_message_to_queue
              (this,(deliver_op_tracer *)&lock.field_0xb,msg_type,message,lock._12_4_);
  }
LAB_00488d7f:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return;
}

Assistant:

void
		try_to_store_message_from_timer_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				bool queue_full = m_queue.is_full();
				// NOTE: there is no awaiting on full mchain.
				// If queue full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction ||
								overflow_reaction_t::throw_exception == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}